

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::expectToken(Reader *this,TokenType type,Token *token,char *message)

{
  char *pcVar1;
  allocator local_51;
  string local_50;
  char *local_30;
  char *message_local;
  Token *token_local;
  Reader *pRStack_18;
  TokenType type_local;
  Reader *this_local;
  
  local_30 = message;
  message_local = (char *)token;
  token_local._4_4_ = type;
  pRStack_18 = this;
  readToken(this,token);
  pcVar1 = local_30;
  if (*(TokenType *)message_local == token_local._4_4_) {
    this_local._7_1_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
    this_local._7_1_ = addError(this,&local_50,(Token *)message_local,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Reader::expectToken(TokenType type, Token& token, const char* message) {
  readToken(token);
  if (token.type_ != type)
    return addError(message, token);
  return true;
}